

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v6::internal::
     handle_cstring_type_spec<char,fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::cstring_spec_handler>
               (char spec,cstring_spec_handler *handler)

{
  size_t in_RCX;
  void *in_RDX;
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 != 0x73) {
    if (iVar1 == 0x70) {
      basic_writer<fmt::v6::buffer_range<char>_>::write_pointer<unsigned_long>
                (&handler->formatter->writer_,(unsigned_long)handler->value,
                 handler->formatter->specs_);
      return;
    }
    if (iVar1 != 0) {
      error_handler::on_error((error_handler *)handler,"invalid type specifier");
    }
  }
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>::write
            (handler->formatter,(int)handler->value,in_RDX,in_RCX);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_cstring_type_spec(Char spec, Handler&& handler) {
  if (spec == 0 || spec == 's')
    handler.on_string();
  else if (spec == 'p')
    handler.on_pointer();
  else
    handler.on_error("invalid type specifier");
}